

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Command.cpp
# Opt level: O1

void __thiscall IRCCommand::IRCCommand(IRCCommand *this)

{
  IRCCommand *local_20;
  
  (this->super_Command).m_triggers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_Command).m_triggers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_Command).m_triggers.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_Command)._vptr_Command = (_func_int **)&PTR___cxa_pure_virtual_00113bc0;
  this->m_access = 0;
  (this->m_types).
  super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_types).
  super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_types).
  super__Vector_base<IRCCommand::TypeAccessPair,_std::allocator<IRCCommand::TypeAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_channels).
  super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_channels).
  super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_channels).
  super__Vector_base<IRCCommand::ChannelAccessPair,_std::allocator<IRCCommand::ChannelAccessPair>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_20 = this;
  std::vector<IRCCommand*,std::allocator<IRCCommand*>>::emplace_back<IRCCommand*>
            ((vector<IRCCommand*,std::allocator<IRCCommand*>> *)&g_IRCMasterCommandList,&local_20);
  return;
}

Assistant:

IRCCommand::IRCCommand() {
	m_access = 0;
	IRCMasterCommandList.push_back(this);
}